

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong
          (TestParsingMergeLite_RepeatedFieldsGenerator *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar3;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *this_00;
  reference value;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *this_01;
  reference value_00;
  reference pTVar4;
  size_t sVar5;
  long lVar6;
  TestAllTypesLite *msg_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2_6;
  TestAllTypesLite *msg_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2_5;
  TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *msg_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *__range2_4
  ;
  TestParsingMergeLite_RepeatedFieldsGenerator_Group1 *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *__range2_3
  ;
  TestAllTypesLite *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2_2;
  TestAllTypesLite *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2_1;
  TestAllTypesLite *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestParsingMergeLite_RepeatedFieldsGenerator *this_;
  TestParsingMergeLite_RepeatedFieldsGenerator *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_field1_size(this);
  sStack_58 = (size_t)iVar2;
  pRVar3 = _internal_field1(this);
  __end2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(pRVar3);
  msg = (TestAllTypesLite *)
        google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar1) {
    pTVar4 = google::protobuf::internal::
             RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(pTVar4);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2);
  }
  iVar2 = _internal_field2_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  pRVar3 = _internal_field2(this);
  __end2_1 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(pRVar3);
  msg_1 = (TestAllTypesLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar1) {
    pTVar4 = google::protobuf::internal::
             RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::operator*(&__end2_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(pTVar4);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2_1);
  }
  iVar2 = _internal_field3_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  pRVar3 = _internal_field3(this);
  __end2_2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(pRVar3);
  msg_2 = (TestAllTypesLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_2,(iterator *)&msg_2), bVar1) {
    pTVar4 = google::protobuf::internal::
             RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::operator*(&__end2_2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(pTVar4);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2_2);
  }
  iVar2 = _internal_group1_size(this);
  sStack_58 = (long)iVar2 * 2 + sStack_58;
  this_00 = _internal_group1(this);
  __end2_3 = google::protobuf::
             RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
             ::begin(this_00);
  msg_3 = (TestParsingMergeLite_RepeatedFieldsGenerator_Group1 *)
          google::protobuf::
          RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::
          end(this_00);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_3,(iterator *)&msg_3), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
            ::operator*(&__end2_3);
    sVar5 = google::protobuf::internal::WireFormatLite::
            GroupSize<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>(value);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
    ::operator++(&__end2_3);
  }
  iVar2 = _internal_group2_size(this);
  sStack_58 = (long)iVar2 * 4 + sStack_58;
  this_01 = _internal_group2(this);
  __end2_4 = google::protobuf::
             RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
             ::begin(this_01);
  msg_4 = (TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *)
          google::protobuf::
          RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::
          end(this_01);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_4,(iterator *)&msg_4), bVar1) {
    value_00 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
               ::operator*(&__end2_4);
    sVar5 = google::protobuf::internal::WireFormatLite::
            GroupSize<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
                      (value_00);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
    ::operator++(&__end2_4);
  }
  iVar2 = _internal_ext1_size(this);
  sStack_58 = (long)iVar2 * 2 + sStack_58;
  pRVar3 = _internal_ext1(this);
  __end2_5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(pRVar3);
  msg_5 = (TestAllTypesLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_5,(iterator *)&msg_5), bVar1) {
    pTVar4 = google::protobuf::internal::
             RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::operator*(&__end2_5);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(pTVar4);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2_5);
  }
  iVar2 = _internal_ext2_size(this);
  sStack_58 = (long)iVar2 * 2 + sStack_58;
  pRVar3 = _internal_ext2(this);
  __end2_6 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::begin(pRVar3);
  msg_6 = (TestAllTypesLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar3);
  while (bVar1 = google::protobuf::internal::operator!=(&__end2_6,(iterator *)&msg_6), bVar1) {
    pTVar4 = google::protobuf::internal::
             RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::operator*(&__end2_6);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>(pTVar4);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite>::
    operator++(&__end2_6);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar6 = std::__cxx11::string::size();
    sStack_58 = lVar6 + sStack_58;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar2);
  return sStack_58;
}

Assistant:

::size_t TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong() const {
  const TestParsingMergeLite_RepeatedFieldsGenerator& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite field1 = 1;
    {
      total_size += 1UL * this_._internal_field1_size();
      for (const auto& msg : this_._internal_field1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field2 = 2;
    {
      total_size += 1UL * this_._internal_field2_size();
      for (const auto& msg : this_._internal_field2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field3 = 3;
    {
      total_size += 1UL * this_._internal_field3_size();
      for (const auto& msg : this_._internal_field3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group1 group1 = 10 [features = {
    {
      total_size += 2UL * this_._internal_group1_size();
      for (const auto& msg : this_._internal_group1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2 group2 = 20 [features = {
    {
      total_size += 4UL * this_._internal_group2_size();
      for (const auto& msg : this_._internal_group2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext1 = 1000;
    {
      total_size += 2UL * this_._internal_ext1_size();
      for (const auto& msg : this_._internal_ext1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext2 = 1001;
    {
      total_size += 2UL * this_._internal_ext2_size();
      for (const auto& msg : this_._internal_ext2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}